

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong uVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *psVar5;
  FieldGenerator *pFVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  this->descriptor_ = descriptor;
  lVar7 = (long)*(int *)(descriptor + 0x2c);
  uVar1 = lVar7 * 8;
  uVar8 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar8 = 0xffffffffffffffff;
  }
  if (lVar7 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar8);
  *plVar4 = lVar7;
  if (lVar7 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1),0,
           uVar1);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(descriptor + 0x78);
  lVar7 = (long)iVar2;
  uVar1 = lVar7 * 8;
  uVar8 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar8 = 0xffffffffffffffff;
  }
  if (lVar7 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar8);
  *plVar4 = lVar7;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1),0,
           uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(plVar4 + 1);
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator[](&this->field_generators_,lVar9);
      pFVar6 = FieldGenerator::Make
                         ((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar7),options);
      pFVar3 = psVar5->ptr_;
      if (pFVar3 != pFVar6) {
        if (pFVar3 != (FieldGenerator *)0x0) {
          (*pFVar3->_vptr_FieldGenerator[1])();
        }
        psVar5->ptr_ = pFVar6;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar9 < *(int *)(descriptor + 0x2c));
  }
  if (0 < *(int *)(descriptor + 0x78)) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator[](&this->extension_generators_,lVar9);
      pFVar6 = FieldGenerator::Make
                         ((FieldDescriptor *)(*(long *)(descriptor + 0x80) + lVar7),options);
      pFVar3 = psVar5->ptr_;
      if (pFVar3 != pFVar6) {
        if (pFVar3 != (FieldGenerator *)0x0) {
          (*pFVar3->_vptr_FieldGenerator[1])();
        }
        psVar5->ptr_ = pFVar6;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar9 < *(int *)(descriptor + 0x78));
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->field_count()]),
      extension_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->extension_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}